

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadFunctionBodyHeader
          (ByteCodeBufferReader *this,byte *functionBytes,int *displayNameId,int *lineNumber,
          int *columnNumber,uint *bitflags)

{
  byte *pbVar1;
  
  pbVar1 = functionBytes + 8;
  if ((functionBytes[6] & 1) == 0) {
    *lineNumber = 0;
  }
  else {
    pbVar1 = ReadInt32(pbVar1,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar1)),
                       lineNumber);
  }
  if ((functionBytes[6] & 2) == 0) {
    *columnNumber = 0;
  }
  else {
    pbVar1 = ReadInt32(pbVar1,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar1)),
                       columnNumber);
  }
  pbVar1 = ReadConstantSizedInt32
                     (pbVar1,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar1)),
                      (int *)bitflags);
  if ((*bitflags & 0x100000) == 0) {
    pbVar1 = ReadInt32(pbVar1,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar1)),
                       displayNameId);
    return pbVar1;
  }
  *displayNameId = -1;
  return pbVar1;
}

Assistant:

const byte * ReadFunctionBodyHeader(const byte * functionBytes, int& displayNameId, int& lineNumber, int& columnNumber, unsigned int& bitflags)
    {
        serialization_alignment SerializedFieldList* definedFields = (serialization_alignment SerializedFieldList*) functionBytes;

        // Basic function body constructor arguments
        const byte * current = functionBytes + sizeof(serialization_alignment SerializedFieldList);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfFunctionBody);
#endif
        if (definedFields->has_m_lineNumber)
        {
            current = ReadInt32(current, &lineNumber);
        }
        else
        {
            lineNumber = 0;
        }

        if (definedFields->has_m_columnNumber)
        {
            current = ReadInt32(current, &columnNumber);
        }
        else
        {
            columnNumber = 0;
        }

        current = ReadConstantSizedUInt32(current, &bitflags);

        if (bitflags & ffIsAnonymous)
        {
            displayNameId = -1;
        }
        else
        {
            current = ReadInt32(current, &displayNameId);
        }
        return current;
    }